

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

int wstatus_to_exit_status(pid_t pid,int wstatus)

{
  int local_14;
  int result;
  int wstatus_local;
  pid_t pid_local;
  
  if (((wstatus & 0x7fU) != 0) && ((char)(((byte)wstatus & 0x7f) + 1) >> 1 < '\x01')) {
    __assert_fail("WIFEXITED(wstatus) || WIFSIGNALED(wstatus)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/proc.c"
                  ,0x24,"int wstatus_to_exit_status(pid_t, int)");
  }
  if ((wstatus & 0x7fU) == 0) {
    local_14 = (int)(wstatus & 0xff00U) >> 8;
  }
  else {
    if ('\0' < (char)(((byte)wstatus & 0x7f) + 1) >> 1) {
      if ((wstatus & 0x80U) == 0) {
        fprintf(_stderr,"Process %d was stopped by signal %d\n",(ulong)(uint)pid,
                (ulong)(wstatus & 0x7f));
      }
      else {
        fprintf(_stderr,"Process %d core dumped (signal: %d)\n",(ulong)(uint)pid,
                (ulong)(wstatus & 0x7f));
      }
    }
    local_14 = 1;
  }
  return local_14;
}

Assistant:

static int wstatus_to_exit_status(pid_t pid, int wstatus) {
    int result = EXIT_FAILURE;
    assert(WIFEXITED(wstatus) || WIFSIGNALED(wstatus));

    if (WIFEXITED(wstatus)) {
        result = WEXITSTATUS(wstatus);
    } else if (WIFSIGNALED(wstatus)) {
        if (WCOREDUMP(wstatus)) {
            fprintf(stderr, "Process %d core dumped (signal: %d)\n", pid,
                    WTERMSIG(wstatus));
            result = EXIT_FAILURE;
        } else {
            fprintf(stderr, "Process %d was stopped by signal %d\n", pid,
                    WTERMSIG(wstatus));
            result = EXIT_FAILURE;
        }
    }

    return result;
}